

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

int target_data_begin(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,
                     int64_t *arg_sizes,int64_t *arg_types)

{
  ulong uVar1;
  undefined8 *HstPtrBegin;
  void *pvVar2;
  pthread_mutex_t *__mutex;
  int32_t iVar3;
  void *TgtPtrBegin;
  mapped_type *pmVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  void *pvVar8;
  bool UpdateRefCount;
  undefined8 *HstPtrBase;
  ulong uVar9;
  bool IsNew;
  bool Pointer_IsNew;
  DeviceTy *local_90;
  int local_84;
  void *local_80;
  void **local_78;
  void **local_70;
  void *TgtPtrBase;
  void *local_60;
  ShadowPtrListTy *local_58;
  pthread_mutex_t *local_50;
  ulong local_48;
  int64_t *local_40;
  void *Pointer_HstPtrBegin;
  
  local_50 = (pthread_mutex_t *)&Device->ShadowMtx;
  uVar6 = 0;
  if (0 < arg_num) {
    uVar6 = (ulong)(uint)arg_num;
  }
  local_58 = &Device->ShadowPtrMap;
  local_48 = 0;
  local_90 = Device;
  local_78 = args;
  local_70 = args_base;
  while (uVar9 = local_48, uVar6 != uVar9) {
    uVar1 = arg_types[uVar9];
    if ((uVar1 & 0x180) == 0) {
      local_80 = local_78[uVar9];
      HstPtrBegin = (undefined8 *)local_70[uVar9];
      lVar7 = arg_sizes[uVar9];
      local_48 = uVar9 + 1;
      UpdateRefCount = uVar1 >> 0x30 == 0;
      if ((((int)local_48 < arg_num && UpdateRefCount) &&
          (*(ushort *)((long)arg_types + uVar9 * 8 + 0xe) - 1 == uVar9)) &&
         (lVar5 = (long)local_80 % 8, lVar5 != 0)) {
        local_80 = (void *)((long)local_80 - lVar5);
        lVar7 = lVar7 + lVar5;
      }
      pvVar8 = local_80;
      HstPtrBase = HstPtrBegin;
      local_84 = arg_num;
      local_40 = arg_sizes;
      if ((uVar1 & 0x10) != 0) {
        local_60 = DeviceTy::getOrAllocTgtPtr
                             (local_90,HstPtrBegin,HstPtrBegin,8,&Pointer_IsNew,
                              (bool)((byte)(uVar1 >> 9) & 1),uVar1 < 0x1000000000000);
        arg_num = local_84;
        if (local_60 == (void *)0x0) break;
        HstPtrBase = (undefined8 *)*HstPtrBegin;
        UpdateRefCount = true;
        pvVar8 = local_80;
        Pointer_HstPtrBegin = HstPtrBegin;
      }
      local_80 = (void *)lVar7;
      TgtPtrBegin = DeviceTy::getOrAllocTgtPtr
                              (local_90,pvVar8,HstPtrBase,lVar7,&IsNew,
                               (bool)((byte)((uint)uVar1 >> 9) & 1),UpdateRefCount);
      uVar1 = arg_types[uVar9];
      if ((uVar1 & 0x40) != 0) {
        local_70[uVar9] = (void *)(((long)HstPtrBase - (long)pvVar8) + (long)TgtPtrBegin);
      }
      if (((uVar1 & 1) != 0) &&
         (((((uVar1 & 4) != 0 || (IsNew != false)) ||
           ((0xffffffffffff < uVar1 &&
            (lVar7 = DeviceTy::getMapEntryRefCnt(local_90,local_78[(ushort)(uVar1 >> 0x30) - 1]),
            lVar7 == 1)))) &&
          (iVar3 = DeviceTy::data_submit(local_90,TgtPtrBegin,pvVar8,(int64_t)local_80),
          arg_num = local_84, iVar3 != 0)))) break;
      pvVar2 = local_60;
      arg_sizes = local_40;
      arg_num = local_84;
      if ((*(byte *)(arg_types + uVar9) & 0x10) != 0) {
        TgtPtrBase = (void *)(((long)HstPtrBase - (long)pvVar8) + (long)TgtPtrBegin);
        iVar3 = DeviceTy::data_submit(local_90,local_60,&TgtPtrBase,8);
        __mutex = local_50;
        arg_num = local_84;
        if (iVar3 != 0) break;
        std::mutex::lock((mutex *)&local_50->__data);
        pvVar8 = TgtPtrBase;
        pmVar4 = std::
                 map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                 ::operator[](local_58,&Pointer_HstPtrBegin);
        pmVar4->HstPtrVal = HstPtrBase;
        pmVar4->TgtPtrAddr = pvVar2;
        pmVar4->TgtPtrVal = pvVar8;
        pthread_mutex_unlock(__mutex);
        arg_sizes = local_40;
        arg_num = local_84;
      }
    }
    else {
      local_48 = uVar9 + 1;
    }
  }
  return -(uint)((long)uVar9 < (long)arg_num);
}

Assistant:

int target_data_begin(DeviceTy &Device, int32_t arg_num,
    void **args_base, void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = 0; i < arg_num; ++i) {
    // Ignore private variables and arrays - there is no mapping for them.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    void *HstPtrBase = args_base[i];
    int64_t data_size = arg_sizes[i];

    // Adjust for proper alignment if this is a combined entry (for structs).
    // Look at the next argument - if that is MEMBER_OF this one, then this one
    // is a combined entry.
    int64_t padding = 0;
    const int next_i = i+1;
    if (member_of(arg_types[i]) < 0 && next_i < arg_num &&
        member_of(arg_types[next_i]) == i) {
      padding = (int64_t)HstPtrBegin % alignment;
      if (padding) {
        DP("Using a padding of %" PRId64 " bytes for begin address " DPxMOD
            "\n", padding, DPxPTR(HstPtrBegin));
        HstPtrBegin = (char *) HstPtrBegin - padding;
        data_size += padding;
      }
    }

    // Address of pointer on the host and device, respectively.
    void *Pointer_HstPtrBegin, *Pointer_TgtPtrBegin;
    bool IsNew, Pointer_IsNew;
    bool IsImplicit = arg_types[i] & OMP_TGT_MAPTYPE_IMPLICIT;
    // UpdateRef is based on MEMBER_OF instead of TARGET_PARAM because if we
    // have reached this point via __tgt_target_data_begin and not __tgt_target
    // then no argument is marked as TARGET_PARAM ("omp target data map" is not
    // associated with a target region, so there are no target parameters). This
    // may be considered a hack, we could revise the scheme in the future.
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF);
    if (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ) {
      DP("Has a pointer entry: \n");
      // base is address of pointer.
      Pointer_TgtPtrBegin = Device.getOrAllocTgtPtr(HstPtrBase, HstPtrBase,
          sizeof(void *), Pointer_IsNew, IsImplicit, UpdateRef);
      if (!Pointer_TgtPtrBegin) {
        DP("Call to getOrAllocTgtPtr returned null pointer (device failure or "
            "illegal mapping).\n");
        return OFFLOAD_FAIL;
      }
      DP("There are %zu bytes allocated at target address " DPxMOD " - is%s new"
          "\n", sizeof(void *), DPxPTR(Pointer_TgtPtrBegin),
          (Pointer_IsNew ? "" : " not"));
      Pointer_HstPtrBegin = HstPtrBase;
      // modify current entry.
      HstPtrBase = *(void **)HstPtrBase;
      UpdateRef = true; // subsequently update ref count of pointee
    }

    void *TgtPtrBegin = Device.getOrAllocTgtPtr(HstPtrBegin, HstPtrBase,
        data_size, IsNew, IsImplicit, UpdateRef);
    if (!TgtPtrBegin && data_size) {
      // If data_size==0, then the argument could be a zero-length pointer to
      // NULL, so getOrAlloc() returning NULL is not an error.
      DP("Call to getOrAllocTgtPtr returned null pointer (device failure or "
          "illegal mapping).\n");
    }
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s new\n", data_size, DPxPTR(TgtPtrBegin),
        (IsNew ? "" : " not"));

    if (arg_types[i] & OMP_TGT_MAPTYPE_RETURN_PARAM) {
      uintptr_t Delta = (uintptr_t)HstPtrBegin - (uintptr_t)HstPtrBase;
      void *TgtPtrBase = (void *)((uintptr_t)TgtPtrBegin - Delta);
      DP("Returning device pointer " DPxMOD "\n", DPxPTR(TgtPtrBase));
      args_base[i] = TgtPtrBase;
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_TO) {
      bool copy = false;
      if (IsNew || (arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS)) {
        copy = true;
      } else if (arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) {
        // Copy data only if the "parent" struct has RefCount==1.
        int32_t parent_idx = member_of(arg_types[i]);
        long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
        assert(parent_rc > 0 && "parent struct not found");
        if (parent_rc == 1) {
          copy = true;
        }
      }

      if (copy) {
        DP("Moving %" PRId64 " bytes (hst:" DPxMOD ") -> (tgt:" DPxMOD ")\n",
            data_size, DPxPTR(HstPtrBegin), DPxPTR(TgtPtrBegin));
        int rt = Device.data_submit(TgtPtrBegin, HstPtrBegin, data_size);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Copying data to device failed.\n");
          return OFFLOAD_FAIL;
        }
      }
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ) {
      DP("Update pointer (" DPxMOD ") -> [" DPxMOD "]\n",
          DPxPTR(Pointer_TgtPtrBegin), DPxPTR(TgtPtrBegin));
      uint64_t Delta = (uint64_t)HstPtrBegin - (uint64_t)HstPtrBase;
      void *TgtPtrBase = (void *)((uint64_t)TgtPtrBegin - Delta);
      int rt = Device.data_submit(Pointer_TgtPtrBegin, &TgtPtrBase,
          sizeof(void *));
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data to device failed.\n");
        return OFFLOAD_FAIL;
      }
      // create shadow pointers for this entry
      Device.ShadowMtx.lock();
      Device.ShadowPtrMap[Pointer_HstPtrBegin] = {HstPtrBase,
          Pointer_TgtPtrBegin, TgtPtrBase};
      Device.ShadowMtx.unlock();
    }
  }

  return OFFLOAD_SUCCESS;
}